

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O2

void opj_pi_update_encoding_parameters(opj_image_t *p_image,opj_cp_t *p_cp,OPJ_UINT32 p_tile_no)

{
  uint uVar1;
  opj_tcp_t *poVar2;
  int iVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  OPJ_INT32 OVar8;
  OPJ_INT32 OVar9;
  OPJ_INT32 OVar10;
  OPJ_INT32 OVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint p_tx1;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  uint p_tx0;
  uint uVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  int iVar24;
  uint uVar25;
  uint p_dx_min;
  undefined8 uVar26;
  opj_tccp_t *local_a8;
  opj_image_comp_t *local_a0;
  
  if (p_cp == (opj_cp_t *)0x0) {
    __assert_fail("p_cp != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/pi.c"
                  ,0x804,
                  "void opj_pi_update_encoding_parameters(const opj_image_t *, opj_cp_t *, OPJ_UINT32)"
                 );
  }
  if (p_image != (opj_image_t *)0x0) {
    uVar21 = p_cp->tw;
    if (p_tile_no < p_cp->th * uVar21) {
      poVar2 = p_cp->tcps;
      local_a0 = p_image->comps;
      local_a8 = poVar2[p_tile_no].tccps;
      uVar7 = p_cp->tdx;
      uVar14 = (p_tile_no % uVar21) * uVar7 + p_cp->tx0;
      uVar25 = p_cp->tdy;
      p_tx0 = p_image->x0;
      if (p_image->x0 < uVar14) {
        p_tx0 = uVar14;
      }
      uVar26 = 0xffffffffffffffff;
      p_tx1 = uVar14 + uVar7;
      if (CARRY4(uVar14,uVar7)) {
        p_tx1 = 0xffffffff;
      }
      if (p_image->x1 <= p_tx1) {
        p_tx1 = p_image->x1;
      }
      uVar7 = (p_tile_no / uVar21) * uVar25 + p_cp->ty0;
      uVar21 = p_image->y0;
      if (p_image->y0 < uVar7) {
        uVar21 = uVar7;
      }
      uVar14 = uVar7 + uVar25;
      if (CARRY4(uVar7,uVar25)) {
        uVar14 = 0xffffffff;
      }
      if (p_image->y1 <= uVar14) {
        uVar14 = p_image->y1;
      }
      uVar25 = 0x7fffffff;
      uVar7 = 0;
      uVar23 = 0;
      p_dx_min = 0x7fffffff;
      for (uVar13 = 0; uVar13 < p_image->numcomps; uVar13 = uVar13 + 1) {
        OVar8 = opj_int_ceildiv(p_tx0,local_a0->dx);
        OVar9 = opj_int_ceildiv(uVar21,local_a0->dy);
        OVar10 = opj_int_ceildiv(p_tx1,local_a0->dx);
        uVar26 = 0x121778;
        OVar11 = opj_int_ceildiv(uVar14,local_a0->dy);
        uVar1 = local_a8->numresolutions;
        uVar12 = uVar1;
        for (lVar18 = 0; uVar12 = uVar12 - 1, (ulong)uVar1 << 2 != lVar18; lVar18 = lVar18 + 4) {
          bVar4 = (byte)uVar12;
          bVar5 = (byte)*(undefined4 *)((long)local_a8->prcw + lVar18);
          uVar17 = local_a0->dx << (bVar4 + bVar5 & 0x1f);
          bVar6 = (byte)*(undefined4 *)((long)local_a8->prch + lVar18);
          uVar19 = local_a0->dy << (bVar4 + bVar6 & 0x1f);
          if (uVar17 <= uVar25) {
            uVar25 = uVar17;
          }
          if (uVar19 <= p_dx_min) {
            p_dx_min = uVar19;
          }
          uVar26 = 0xffffffffffffffff;
          uVar16 = -1L << (bVar4 & 0x3f) ^ 0xffffffffffffffff;
          iVar22 = (int)((long)((long)OVar8 + uVar16) >> (bVar4 & 0x3f));
          iVar20 = (int)((long)((long)OVar9 + uVar16) >> (bVar4 & 0x3f));
          iVar24 = (int)((long)((long)OVar10 + uVar16) >> (bVar4 & 0x3f));
          iVar15 = (int)((long)(uVar16 + (long)OVar11) >> (bVar4 & 0x3f));
          iVar3 = ((int)(~(-1L << (bVar5 & 0x3f)) + (long)iVar24 >> (bVar5 & 0x3f)) -
                   (iVar22 >> (bVar5 & 0x1f)) << (bVar5 & 0x1f)) >> (bVar5 & 0x1f);
          if (iVar22 == iVar24) {
            iVar3 = 0;
          }
          iVar24 = ((int)(~(-1L << (bVar6 & 0x3f)) + (long)iVar15 >> (bVar6 & 0x3f)) -
                    (iVar20 >> (bVar6 & 0x1f)) << (bVar6 & 0x1f)) >> (bVar6 & 0x1f);
          if (iVar20 == iVar15) {
            iVar24 = 0;
          }
          uVar17 = iVar24 * iVar3;
          if ((uint)(iVar24 * iVar3) <= uVar7) {
            uVar17 = uVar7;
          }
          uVar7 = uVar17;
        }
        if ((uint)uVar23 < uVar1) {
          uVar23 = (ulong)uVar1;
        }
        local_a0 = local_a0 + 1;
        local_a8 = local_a8 + 1;
      }
      if ((poVar2[p_tile_no].field_0x1638 & 4) == 0) {
        opj_pi_update_encode_not_poc
                  (p_cp,p_image->numcomps,p_tile_no,p_tx0,p_tx1,uVar21,uVar14,uVar7,(uint)uVar23,
                   uVar25,p_dx_min);
      }
      else {
        opj_pi_update_encode_poc_and_final
                  (p_cp,p_tile_no,p_tx0,p_tx1,uVar21,uVar14,uVar7,uVar25,p_dx_min,(OPJ_UINT32)uVar26
                  );
      }
      return;
    }
    __assert_fail("p_tile_no < p_cp->tw * p_cp->th",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/pi.c"
                  ,0x806,
                  "void opj_pi_update_encoding_parameters(const opj_image_t *, opj_cp_t *, OPJ_UINT32)"
                 );
  }
  __assert_fail("p_image != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/pi.c"
                ,0x805,
                "void opj_pi_update_encoding_parameters(const opj_image_t *, opj_cp_t *, OPJ_UINT32)"
               );
}

Assistant:

void opj_pi_update_encoding_parameters(const opj_image_t *p_image,
                                       opj_cp_t *p_cp,
                                       OPJ_UINT32 p_tile_no)
{
    /* encoding parameters to set */
    OPJ_UINT32 l_max_res;
    OPJ_UINT32 l_max_prec;
    OPJ_INT32 l_tx0, l_tx1, l_ty0, l_ty1;
    OPJ_UINT32 l_dx_min, l_dy_min;

    /* pointers */
    opj_tcp_t *l_tcp = 00;

    /* preconditions */
    assert(p_cp != 00);
    assert(p_image != 00);
    assert(p_tile_no < p_cp->tw * p_cp->th);

    l_tcp = &(p_cp->tcps[p_tile_no]);

    /* get encoding parameters */
    opj_get_encoding_parameters(p_image, p_cp, p_tile_no, &l_tx0, &l_tx1, &l_ty0,
                                &l_ty1, &l_dx_min, &l_dy_min, &l_max_prec, &l_max_res);

    if (l_tcp->POC) {
        opj_pi_update_encode_poc_and_final(p_cp, p_tile_no, l_tx0, l_tx1, l_ty0, l_ty1,
                                           l_max_prec, l_max_res, l_dx_min, l_dy_min);
    } else {
        opj_pi_update_encode_not_poc(p_cp, p_image->numcomps, p_tile_no, l_tx0, l_tx1,
                                     l_ty0, l_ty1, l_max_prec, l_max_res, l_dx_min, l_dy_min);
    }
}